

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O3

void rep0_sock_fini(void *arg)

{
  nni_id_map_fini((nni_id_map *)((long)arg + 0x30));
  rep0_ctx_close((void *)((long)arg + 0x98));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x138));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x128));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
rep0_sock_fini(void *arg)
{
	rep0_sock *s = arg;

	nni_id_map_fini(&s->pipes);
	rep0_ctx_fini(&s->ctx);
	nni_pollable_fini(&s->writable);
	nni_pollable_fini(&s->readable);
	nni_mtx_fini(&s->lk);
}